

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsSetCurrentContext(JsContextRef newContext)

{
  code *pcVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  undefined4 *puVar4;
  ScriptContext *ctx;
  ScriptContext *pSVar5;
  JsErrorCode JVar6;
  Recycler *this;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  TTDJsRTActionResultAutoRecorder local_48;
  
  VALIDATE_ENTER_CURRENT_THREAD();
  local_48.m_actionEvent = (EventLogEntry *)0x0;
  local_48.m_resultPtr = (TTDVar *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    this = (Recycler *)0x0;
  }
  else {
    this = ((((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
           recycler;
  }
  if (newContext == (JsContextRef)0x0) {
    ctx = (ScriptContext *)0x0;
  }
  else {
    ctx = *(ScriptContext **)(*(long *)((long)newContext + 8) + 0x490);
  }
  if (pJVar3 == (JsrtContext *)0x0) {
    pSVar5 = (ScriptContext *)0x0;
  }
  else {
    pSVar5 = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  if (ctx == (ScriptContext *)0x0) {
    if ((pSVar5 != (ScriptContext *)0x0) && (pSVar5->TTDRecordModeEnabled == true)) {
      if (pSVar5->TTDShouldPerformRecordAction == true) {
        TTD::EventLog::RecordJsRTSetCurrentContext(pSVar5->threadContext->TTDLog,&local_48,(Var)0x0)
        ;
      }
      TTD::ThreadContextTTD::SetActiveScriptContext
                (pSVar5->threadContext->TTDContext,(ScriptContext *)0x0);
    }
  }
  else if (ctx->TTDRecordModeEnabled == true) {
    if ((ctx != pSVar5) && (ctx->TTDShouldPerformRecordAction == true)) {
      TTD::EventLog::RecordJsRTSetCurrentContext
                (ctx->threadContext->TTDLog,&local_48,(ctx->super_ScriptContextBase).globalObject);
    }
    TTD::ThreadContextTTD::SetActiveScriptContext(ctx->threadContext->TTDContext,ctx);
  }
  if (pJVar3 != (JsrtContext *)0x0) {
    bVar2 = Memory::Recycler::IsHeapEnumInProgress(this);
    JVar6 = JsErrorHeapEnumInProgress;
    if ((bVar2) ||
       (JVar6 = JsErrorInThreadServiceCallback,
       (((pJVar3->runtime).ptr)->threadContext->threadService).isInCallback != false))
    goto LAB_0036d008;
  }
  bVar2 = JsrtContext::TrySetCurrent((JsrtContext *)newContext);
  JVar6 = JsErrorWrongThread;
  if (bVar2) {
    JVar6 = JsNoError;
  }
LAB_0036d008:
  if ((JVar6 - JsErrorNoCurrentContext < 7) &&
     ((0x43U >> (JVar6 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  if (local_48.m_actionEvent != (EventLogEntry *)0x0) {
    if ((local_48.m_actionEvent)->ResultStatus != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    (local_48.m_actionEvent)->ResultStatus = JVar6;
  }
  return JVar6;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetCurrentContext(_In_opt_ JsContextRef newContext)
{
    VALIDATE_ENTER_CURRENT_THREAD();

    return GlobalAPIWrapper([&] (TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        JsrtContext *currentContext = JsrtContext::GetCurrent();
        Recycler* recycler = currentContext != nullptr ? currentContext->GetScriptContext()->GetRecycler() : nullptr;

#if ENABLE_TTD
        Js::ScriptContext* newScriptContext = newContext != nullptr ? static_cast<JsrtContext*>(newContext)->GetScriptContext() : nullptr;
        Js::ScriptContext* oldScriptContext = currentContext != nullptr ? static_cast<JsrtContext*>(currentContext)->GetScriptContext() : nullptr;

        if(newScriptContext == nullptr)
        {
            if(oldScriptContext == nullptr)
            {
                ; //if newScriptContext and oldScriptContext are null then we don't worry about doing anything
            }
            else
            {
                if(oldScriptContext->IsTTDRecordModeEnabled())
                {
                    //already know newScriptContext != oldScriptContext so don't check again
                    if(oldScriptContext->ShouldPerformRecordAction())
                    {
                        oldScriptContext->GetThreadContext()->TTDLog->RecordJsRTSetCurrentContext(_actionEntryPopper, nullptr);
                    }

                    oldScriptContext->GetThreadContext()->TTDContext->SetActiveScriptContext(nullptr);
                }
            }
        }
        else
        {
            if(newScriptContext->IsTTDRecordModeEnabled())
            {
                if(newScriptContext != oldScriptContext && newScriptContext->ShouldPerformRecordAction())
                {
                    newScriptContext->GetThreadContext()->TTDLog->RecordJsRTSetCurrentContext(_actionEntryPopper, newScriptContext->GetGlobalObject());
                }

                newScriptContext->GetThreadContext()->TTDContext->SetActiveScriptContext(newScriptContext);
            }
        }
#endif

        if (currentContext && recycler->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (currentContext && currentContext->GetRuntime()->GetThreadContext()->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        if (!JsrtContext::TrySetCurrent((JsrtContext *)newContext))
        {
            return JsErrorWrongThread;
        }

        return JsNoError;
    });
}